

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeHalt(Vdbe *p)

{
  sqlite3 *db_00;
  uint uVar1;
  int iVar2;
  bool bVar3;
  int local_30;
  int isSpecialError;
  int eStatementOp;
  int mrc;
  sqlite3 *db;
  int rc;
  Vdbe *p_local;
  
  db_00 = p->db;
  if (db_00->mallocFailed != '\0') {
    p->rc = 7;
  }
  closeAllCursors(p);
  if (p->magic == 0x2df20da3) {
    if ((-1 < p->pc) && ((*(ushort *)&p->field_0xc0 >> 8 & 1) != 0)) {
      local_30 = 0;
      sqlite3VdbeEnter(p);
      uVar1 = p->rc & 0xff;
      bVar3 = true;
      if ((uVar1 != 7) && ((bVar3 = true, uVar1 != 10 && (bVar3 = true, uVar1 != 9)))) {
        bVar3 = uVar1 == 0xd;
      }
      if ((bVar3) && (((*(ushort *)&p->field_0xc0 >> 7 & 1) == 0 || (uVar1 != 9)))) {
        if (((uVar1 == 7) || (uVar1 == 0xd)) && ((*(ushort *)&p->field_0xc0 >> 6 & 1) != 0)) {
          local_30 = 2;
        }
        else {
          sqlite3RollbackAll(db_00,0x204);
          sqlite3CloseSavepoints(db_00);
          db_00->autoCommit = '\x01';
          p->nChange = 0;
        }
      }
      if (p->rc == 0) {
        sqlite3VdbeCheckFk(p,0);
      }
      if ((((db_00->nVTrans < 1) || (db_00->aVTrans != (VTable **)0x0)) &&
          (db_00->autoCommit != '\0')) &&
         (db_00->nVdbeWrite == (uint)((*(ushort *)&p->field_0xc0 >> 7 & 1) == 0))) {
        if ((p->rc == 0) || ((p->errorAction == '\x03' && (!bVar3)))) {
          iVar2 = sqlite3VdbeCheckFk(p,1);
          if (iVar2 == 0) {
            db._4_4_ = vdbeCommit(db_00,p);
          }
          else {
            if ((*(ushort *)&p->field_0xc0 >> 7 & 1) != 0) {
              sqlite3VdbeLeave(p);
              return 1;
            }
            db._4_4_ = 0x313;
          }
          if ((db._4_4_ == 5) && ((*(ushort *)&p->field_0xc0 >> 7 & 1) != 0)) {
            sqlite3VdbeLeave(p);
            return 5;
          }
          if (db._4_4_ == 0) {
            db_00->nDeferredCons = 0;
            db_00->nDeferredImmCons = 0;
            db_00->flags = db_00->flags & 0xfdffffff;
            sqlite3CommitInternalChanges(db_00);
          }
          else {
            p->rc = db._4_4_;
            sqlite3RollbackAll(db_00,0);
            p->nChange = 0;
          }
        }
        else {
          sqlite3RollbackAll(db_00,0);
          p->nChange = 0;
        }
        db_00->nStatement = 0;
      }
      else if (local_30 == 0) {
        if ((p->rc == 0) || (p->errorAction == '\x03')) {
          local_30 = 1;
        }
        else if (p->errorAction == '\x02') {
          local_30 = 2;
        }
        else {
          sqlite3RollbackAll(db_00,0x204);
          sqlite3CloseSavepoints(db_00);
          db_00->autoCommit = '\x01';
          p->nChange = 0;
        }
      }
      if ((local_30 != 0) && (iVar2 = sqlite3VdbeCloseStatement(p,local_30), iVar2 != 0)) {
        if ((p->rc == 0) || ((p->rc & 0xffU) == 0x13)) {
          p->rc = iVar2;
          sqlite3DbFree(db_00,p->zErrMsg);
          p->zErrMsg = (char *)0x0;
        }
        sqlite3RollbackAll(db_00,0x204);
        sqlite3CloseSavepoints(db_00);
        db_00->autoCommit = '\x01';
        p->nChange = 0;
      }
      if ((*(ushort *)&p->field_0xc0 >> 4 & 1) != 0) {
        if (local_30 == 2) {
          sqlite3VdbeSetChanges(db_00,0);
        }
        else {
          sqlite3VdbeSetChanges(db_00,p->nChange);
        }
        p->nChange = 0;
      }
      sqlite3VdbeLeave(p);
    }
    if (-1 < p->pc) {
      db_00->nVdbeActive = db_00->nVdbeActive + -1;
      if ((*(ushort *)&p->field_0xc0 >> 7 & 1) == 0) {
        db_00->nVdbeWrite = db_00->nVdbeWrite + -1;
      }
      if ((*(ushort *)&p->field_0xc0 >> 8 & 1) != 0) {
        db_00->nVdbeRead = db_00->nVdbeRead + -1;
      }
    }
    p->magic = 0x319c2973;
    if (db_00->mallocFailed != '\0') {
      p->rc = 7;
    }
    p_local._4_4_ = 0;
    if (p->rc == 5) {
      p_local._4_4_ = 5;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine. 
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  if( p->magic!=VDBE_MAGIC_RUN ){
    return SQLITE_OK;
  }
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->pc>=0 && p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    mrc = p->rc & 0xff;
    isSpecialError = mrc==SQLITE_NOMEM || mrc==SQLITE_IOERR
                     || mrc==SQLITE_INTERRUPT || mrc==SQLITE_FULL;
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT, 
      ** no rollback is necessary. Otherwise, at least a savepoint 
      ** transaction must be rolled back to restore the database to a 
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error 
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore 
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK ){
      sqlite3VdbeCheckFk(p, 0);
    }
  
    /* If the auto-commit flag is set and this is the only active writer 
    ** VM, then we do either a commit or rollback of the current transaction. 
    **
    ** Note: This block also runs if one of the special errors handled 
    ** above has occurred. 
    */
    if( !sqlite3VtabInSync(db) 
     && db->autoCommit 
     && db->nVdbeWrite==(p->readOnly==0) 
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else{ 
          /* The auto-commit flag is true, the vdbe program was successful 
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit 
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter. 
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  if( p->pc>=0 ){
    db->nVdbeActive--;
    if( !p->readOnly ) db->nVdbeWrite--;
    if( p->bIsReader ) db->nVdbeRead--;
    assert( db->nVdbeActive>=db->nVdbeRead );
    assert( db->nVdbeRead>=db->nVdbeWrite );
    assert( db->nVdbeWrite>=0 );
  }
  p->magic = VDBE_MAGIC_HALT;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked() 
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}